

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall duckdb::StringValueScanner::FinalizeChunkProcess(StringValueScanner *this)

{
  StringValueResult *result;
  idx_t *piVar1;
  int64_t *piVar2;
  shared_ptr<duckdb::CSVBufferHandle,_true> *this_00;
  LineError *this_01;
  ulong *puVar3;
  CSVErrorType CVar4;
  CSVState CVar5;
  idx_t iVar6;
  pointer pCVar7;
  ulong uVar8;
  ValidityMask *pVVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  byte bVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  bool bVar13;
  const_iterator __end2;
  CSVFileScan *pCVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  CSVBufferHandle *pCVar17;
  CSVStateMachine *pCVar18;
  pointer pCVar19;
  pointer pCVar20;
  vector<duckdb::CurrentError,_true> *__range2;
  bool bVar21;
  bool bVar22;
  CSVErrorType type;
  _Head_base<0UL,_unsigned_long_*,_false> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  _Head_base<0UL,_unsigned_long_*,_false> local_38;
  
  if (((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) ||
     ((this->super_BaseScanner).iterator.done == true)) {
    if ((this->super_BaseScanner).sniffing != false) {
      return;
    }
    if ((this->super_BaseScanner).csv_file_scan.internal.
        super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return;
    }
    iVar6 = (this->super_BaseScanner).bytes_read;
    pCVar14 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                        (&(this->super_BaseScanner).csv_file_scan);
    LOCK();
    (pCVar14->bytes_read).super___atomic_base<unsigned_long>._M_i =
         (pCVar14->bytes_read).super___atomic_base<unsigned_long>._M_i + iVar6;
    UNLOCK();
    (this->super_BaseScanner).bytes_read = 0;
    return;
  }
  result = &this->result;
  if ((this->super_BaseScanner).iterator.is_set == false) {
    while ((bVar13 = BaseScanner::FinishedFile(&this->super_BaseScanner), !bVar13 &&
           ((ulong)(this->result).number_of_rows < (this->result).super_ScannerResult.result_size)))
    {
      MoveToNextBuffer(this);
      if ((this->result).super_ScannerResult.result_size <= (ulong)(this->result).number_of_rows) {
        return;
      }
      if ((this->super_BaseScanner).cur_buffer_handle.internal.
          super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        BaseScanner::Process<duckdb::StringValueResult>(&this->super_BaseScanner,result);
      }
    }
    bVar13 = BaseScanner::FinishedFile(&this->super_BaseScanner);
    (this->super_BaseScanner).iterator.done = bVar13;
    if ((this->result).null_padding != true) {
      return;
    }
    if (0x7ff < (this->result).number_of_rows) {
      return;
    }
    if ((this->result).chunk_col_id == 0) {
      return;
    }
    uVar15 = (this->result).chunk_col_id;
    if (uVar15 < (ulong)(((long)*(pointer *)
                                 ((long)&(this->result).parse_chunk.data.
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                          (long)(this->result).parse_chunk.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)
       ) {
      do {
        (this->result).chunk_col_id = uVar15 + 1;
        uVar8 = (this->result).number_of_rows;
        pVVar9 = (this->result).validity_mask.
                 super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
                 super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15];
        if ((pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38._M_head_impl =
               (unsigned_long *)(pVVar9->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_48,(unsigned_long *)&local_38);
          p_Var12 = p_Stack_40;
          _Var11._M_head_impl = local_48._M_head_impl;
          local_48._M_head_impl = (unsigned_long *)0x0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_02 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))
                    ->_M_pi;
          (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var11._M_head_impl;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data + 8))->_M_pi =
               p_Var12;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
          if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_data);
          (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar10 = (byte)uVar8 & 0x3f;
        puVar3 = (pVVar9->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar8 >> 6);
        *puVar3 = *puVar3 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
        piVar1 = &(this->result).cur_col_id;
        *piVar1 = *piVar1 + 1;
        uVar15 = (this->result).chunk_col_id;
      } while (uVar15 < (ulong)(((long)*(pointer *)
                                        ((long)&(this->result).parse_chunk.data.
                                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                .
                                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                                ._M_impl.super__Vector_impl_data + 8) -
                                 (long)(this->result).parse_chunk.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
    piVar2 = &(this->result).number_of_rows;
    *piVar2 = *piVar2 + 1;
    return;
  }
  pCVar19 = (this->result).current_errors.current_errors.
            super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
            super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar7 = *(pointer *)
            ((long)&(this->result).current_errors.current_errors.
                    super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    _M_impl.super__Vector_impl_data + 8);
  bVar21 = pCVar19 != pCVar7;
  bVar13 = bVar21;
  if (bVar21) {
    CVar4 = pCVar19->type;
    pCVar20 = pCVar19;
    while (CVar4 != UNTERMINATED_QUOTES) {
      pCVar20 = pCVar20 + 1;
      bVar13 = pCVar20 != pCVar7;
      if (pCVar20 == pCVar7) break;
      CVar4 = pCVar20->type;
    }
  }
  if (bVar13) {
LAB_01516ba9:
    if (pCVar19 != pCVar7) {
      CVar4 = pCVar19->type;
      while (CVar4 != UNTERMINATED_QUOTES) {
        pCVar19 = pCVar19 + 1;
        bVar21 = pCVar19 != pCVar7;
        if (pCVar19 == pCVar7) break;
        CVar4 = pCVar19->type;
      }
    }
    if (bVar21) {
      local_48._M_head_impl._0_1_ = 4;
    }
    else {
      local_48._M_head_impl._0_1_ = 9;
    }
    bVar13 = true;
  }
  else {
    bVar13 = bVar21;
    if (pCVar19 != pCVar7) {
      CVar4 = pCVar19->type;
      pCVar20 = pCVar19;
      while (CVar4 != INVALID_STATE) {
        pCVar20 = pCVar20 + 1;
        bVar13 = pCVar20 != pCVar7;
        if (pCVar20 == pCVar7) break;
        CVar4 = pCVar20->type;
      }
    }
    if (bVar13) goto LAB_01516ba9;
    (this->super_BaseScanner).iterator.done = true;
    bVar13 = false;
  }
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    return;
  }
  bVar21 = MoveToNextBuffer(this);
  if ((this->super_BaseScanner).cur_buffer_handle.internal.
      super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = &(this->super_BaseScanner).cur_buffer_handle;
    if (!bVar21 || (this->result).cur_col_id != 0 && bVar21) {
      ProcessExtraRow(this);
    }
    pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00);
    if ((pCVar17->is_last_buffer == true) &&
       (uVar15 = (this->super_BaseScanner).iterator.pos.buffer_pos,
       pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(this_00),
       pCVar17->actual_size <= uVar15)) {
      MoveToNextBuffer(this);
    }
  }
  pCVar19 = (this->result).current_errors.current_errors.
            super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
            super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar7 = *(pointer *)
            ((long)&(this->result).current_errors.current_errors.
                    super_vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    super__Vector_base<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>.
                    _M_impl.super__Vector_impl_data + 8);
  bVar22 = pCVar19 != pCVar7;
  bVar21 = bVar22;
  if (bVar22) {
    CVar4 = pCVar19->type;
    pCVar20 = pCVar19;
    while (CVar4 != UNTERMINATED_QUOTES) {
      pCVar20 = pCVar20 + 1;
      bVar21 = pCVar20 != pCVar7;
      if (pCVar20 == pCVar7) break;
      CVar4 = pCVar20->type;
    }
  }
  this_01 = &(this->result).current_errors;
  if (bVar21) {
    local_48._M_head_impl._0_1_ = 4;
  }
  else {
    if (pCVar19 != pCVar7) {
      CVar4 = pCVar19->type;
      while (CVar4 != INVALID_STATE) {
        pCVar19 = pCVar19 + 1;
        bVar22 = pCVar19 != pCVar7;
        if (pCVar19 == pCVar7) break;
        CVar4 = pCVar19->type;
      }
    }
    if (!bVar22) goto LAB_01516e49;
    local_48._M_head_impl._0_1_ = 9;
  }
  bVar13 = true;
LAB_01516e49:
  bVar21 = LineError::HandleErrors(this_01,result);
  if (bVar21) {
    piVar2 = &(this->result).number_of_rows;
    *piVar2 = *piVar2 + 1;
  }
  CVar5 = (this->super_BaseScanner).states.states[1];
  if ((!bVar13 && (CVar5 == QUOTED_NEW_LINE || CVar5 == QUOTED)) &&
     (pCVar18 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          (&(this->super_BaseScanner).state_machine),
     (pCVar18->dialect_options).state_machine_options.strict_mode.value == true)) {
    local_48._M_head_impl._0_1_ = 4;
    LineError::Insert(this_01,(CSVErrorType *)&local_48,&(this->result).cur_col_id,
                      &(this->result).chunk_col_id,&(this->result).super_ScannerResult.last_position
                      ,0);
    bVar13 = LineError::HandleErrors(this_01,result);
    if (bVar13) {
      piVar2 = &(this->result).number_of_rows;
      *piVar2 = *piVar2 + 1;
    }
  }
  if (((this->super_BaseScanner).iterator.done == false) &&
     (((this->super_BaseScanner).iterator.boundary.end_pos <=
       (this->super_BaseScanner).iterator.pos.buffer_pos ||
      (bVar13 = BaseScanner::FinishedFile(&this->super_BaseScanner), bVar13)))) {
    (this->super_BaseScanner).iterator.done = true;
  }
  return;
}

Assistant:

void StringValueScanner::FinalizeChunkProcess() {
	if (static_cast<idx_t>(result.number_of_rows) >= result.result_size || iterator.done) {
		// We are done
		if (!sniffing) {
			if (csv_file_scan) {
				csv_file_scan->bytes_read += bytes_read;
				bytes_read = 0;
			}
		}
		return;
	}
	// If we are not done we have two options.
	// 1) If a boundary is set.
	if (iterator.IsBoundarySet()) {
		bool found_error = false;
		CSVErrorType type;
		if (!result.current_errors.HasErrorType(UNTERMINATED_QUOTES) &&
		    !result.current_errors.HasErrorType(INVALID_STATE)) {
			iterator.done = true;
		} else {
			found_error = true;
			if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
				type = UNTERMINATED_QUOTES;
			} else {
				type = INVALID_STATE;
			}
		}
		// We read until the next line or until we have nothing else to read.
		// Move to next buffer
		if (!cur_buffer_handle) {
			return;
		}
		bool moved = MoveToNextBuffer();
		if (cur_buffer_handle) {
			if (moved && result.cur_col_id > 0) {
				ProcessExtraRow();
			} else if (!moved) {
				ProcessExtraRow();
			}
			if (cur_buffer_handle->is_last_buffer && iterator.pos.buffer_pos >= cur_buffer_handle->actual_size) {
				MoveToNextBuffer();
			}
		}
		if (result.current_errors.HasErrorType(UNTERMINATED_QUOTES)) {
			found_error = true;
			type = UNTERMINATED_QUOTES;
		} else if (result.current_errors.HasErrorType(INVALID_STATE)) {
			found_error = true;
			type = INVALID_STATE;
		}
		if (result.current_errors.HandleErrors(result)) {
			result.number_of_rows++;
		}
		if (states.IsQuotedCurrent() && !found_error &&
		    state_machine->dialect_options.state_machine_options.strict_mode.GetValue()) {
			type = UNTERMINATED_QUOTES;
			// If we finish the execution of a buffer, and we end in a quoted state, it means we have unterminated
			// quotes
			result.current_errors.Insert(type, result.cur_col_id, result.chunk_col_id, result.last_position);
			if (result.current_errors.HandleErrors(result)) {
				result.number_of_rows++;
			}
		}
		if (!iterator.done) {
			if (iterator.pos.buffer_pos >= iterator.GetEndPos() || iterator.pos.buffer_idx > iterator.GetBufferIdx() ||
			    FinishedFile()) {
				iterator.done = true;
			}
		}
	} else {
		// 2) If a boundary is not set
		// We read until the chunk is complete, or we have nothing else to read.
		while (!FinishedFile() && static_cast<idx_t>(result.number_of_rows) < result.result_size) {
			MoveToNextBuffer();
			if (static_cast<idx_t>(result.number_of_rows) >= result.result_size) {
				return;
			}
			if (cur_buffer_handle) {
				Process(result);
			}
		}
		iterator.done = FinishedFile();
		if (result.null_padding && result.number_of_rows < STANDARD_VECTOR_SIZE && result.chunk_col_id > 0) {
			while (result.chunk_col_id < result.parse_chunk.ColumnCount()) {
				result.validity_mask[result.chunk_col_id++]->SetInvalid(static_cast<idx_t>(result.number_of_rows));
				result.cur_col_id++;
			}
			result.number_of_rows++;
		}
	}
}